

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int32_t *piVar5;
  uint *puVar6;
  bool *pbVar7;
  lbool *plVar8;
  char *pcVar9;
  char *pcVar10;
  double dVar11;
  double dVar12;
  int local_5a0;
  char *local_560;
  char *local_550;
  FILE *local_530;
  char *local_510;
  gzFile local_500;
  OutOfMemoryException *anon_var_0;
  Size local_4b0;
  lbool local_4a9;
  int i;
  lbool ret;
  vec<Minisat::Lit,_int> dummy;
  double parsed_time;
  FILE *res;
  gzFile in;
  double initial_time;
  Solver S;
  undefined1 local_118 [8];
  BoolOption strictp;
  undefined1 local_e0 [8];
  IntOption mem_lim;
  undefined1 local_a0 [8];
  IntOption cpu_lim;
  undefined1 local_60 [8];
  IntOption verb;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  Minisat::setUsageHelp
            (
            "USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n"
            );
  Minisat::setX86FPUPrecision();
  Minisat::IntRange::IntRange((IntRange *)&cpu_lim.value,0,2);
  Minisat::IntOption::IntOption
            ((IntOption *)local_60,"MAIN","verb","Verbosity level (0=silent, 1=some, 2=more).",1,
             (IntRange)cpu_lim._48_8_);
  Minisat::IntRange::IntRange((IntRange *)&mem_lim.value,0,0x7fffffff);
  Minisat::IntOption::IntOption
            ((IntOption *)local_a0,"MAIN","cpu-lim","Limit on CPU time allowed in seconds.\n",0,
             (IntRange)mem_lim._48_8_);
  Minisat::IntRange::IntRange((IntRange *)&strictp.value,0,0x7fffffff);
  Minisat::IntOption::IntOption
            ((IntOption *)local_e0,"MAIN","mem-lim","Limit on memory usage in megabytes.\n",0,
             (IntRange)strictp._40_8_);
  Minisat::BoolOption::BoolOption
            ((BoolOption *)local_118,"MAIN","strict","Validate DIMACS header during parsing.",false)
  ;
  Minisat::parseOptions((int *)&argv_local,argv,true);
  Minisat::Solver::Solver((Solver *)&initial_time);
  dVar11 = Minisat::cpuTime();
  piVar5 = Minisat::IntOption::operator_cast_to_int_((IntOption *)local_60);
  iVar4 = *piVar5;
  solver = (Solver *)&initial_time;
  Minisat::sigTerm(SIGINT_exit);
  piVar5 = Minisat::IntOption::operator_cast_to_int_((IntOption *)local_a0);
  if (*piVar5 != 0) {
    puVar6 = (uint *)Minisat::IntOption::operator_cast_to_int_((IntOption *)local_a0);
    Minisat::limitTime(*puVar6);
  }
  piVar5 = Minisat::IntOption::operator_cast_to_int_((IntOption *)local_e0);
  if (*piVar5 != 0) {
    piVar5 = Minisat::IntOption::operator_cast_to_int_((IntOption *)local_e0);
    Minisat::limitMemory((long)*piVar5);
  }
  if ((int)argv_local == 1) {
    printf("Reading from standard input... Use \'--help\' for help.\n");
  }
  if ((int)argv_local == 1) {
    local_500 = (gzFile)gzdopen(0,"rb");
  }
  else {
    local_500 = (gzFile)gzopen(argv[1],"rb");
  }
  if (local_500 != (gzFile)0x0) {
    if (0 < iVar4) {
      printf("============================[ Problem Statistics ]=============================\n");
      printf("|                                                                             |\n");
    }
    pbVar7 = Minisat::BoolOption::operator_cast_to_bool_((BoolOption *)local_118);
    Minisat::parse_DIMACS<Minisat::Solver>(local_500,(Solver *)&initial_time,(bool)(*pbVar7 & 1));
    gzclose(local_500);
    if ((int)argv_local < 3) {
      local_530 = (FILE *)0x0;
    }
    else {
      local_530 = fopen(argv[2],"wb");
    }
    if (0 < iVar4) {
      uVar3 = Minisat::Solver::nVars((Solver *)&initial_time);
      printf("|  Number of variables:  %12d                                         |\n",
             (ulong)uVar3);
      uVar3 = Minisat::Solver::nClauses((Solver *)&initial_time);
      printf("|  Number of clauses:    %12d                                         |\n",
             (ulong)uVar3);
    }
    dVar12 = Minisat::cpuTime();
    if (0 < iVar4) {
      printf("|  Parse time:           %12.2f s                                       |\n",
             dVar12 - dVar11);
      printf("|                                                                             |\n");
    }
    Minisat::sigTerm(SIGINT_interrupt);
    bVar1 = Minisat::Solver::simplify();
    if ((bVar1 & 1) != 0) {
      Minisat::vec<Minisat::Lit,_int>::vec((vec<Minisat::Lit,_int> *)&i);
      local_4a9 = Minisat::Solver::solveLimited
                            ((Solver *)&initial_time,(vec<Minisat::Lit,_int> *)&i);
      if (0 < iVar4) {
        Minisat::Solver::printStats();
        printf("\n");
      }
      bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_True);
      if (bVar2) {
        local_550 = "SATISFIABLE\n";
      }
      else {
        bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_False);
        if (bVar2) {
          local_560 = "UNSATISFIABLE\n";
        }
        else {
          local_560 = "INDETERMINATE\n";
        }
        local_550 = local_560;
      }
      printf(local_550);
      if (local_530 != (FILE *)0x0) {
        bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_True);
        if (bVar2) {
          fprintf(local_530,"SAT\n");
          for (local_4b0 = 0; iVar4 = Minisat::Solver::nVars((Solver *)&initial_time),
              local_4b0 < iVar4; local_4b0 = local_4b0 + 1) {
            plVar8 = Minisat::vec<Minisat::lbool,_int>::operator[]
                               ((vec<Minisat::lbool,_int> *)&S,local_4b0);
            bVar2 = Minisat::lbool::operator!=(plVar8,Minisat::l_Undef);
            if (bVar2) {
              pcVar9 = " ";
              if (local_4b0 == 0) {
                pcVar9 = "";
              }
              plVar8 = Minisat::vec<Minisat::lbool,_int>::operator[]
                                 ((vec<Minisat::lbool,_int> *)&S,local_4b0);
              bVar2 = Minisat::lbool::operator==(plVar8,Minisat::l_True);
              pcVar10 = "-";
              if (bVar2) {
                pcVar10 = "";
              }
              fprintf(local_530,"%s%s%d",pcVar9,pcVar10,(ulong)(local_4b0 + 1));
            }
          }
          fprintf(local_530," 0\n");
        }
        else {
          bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_False);
          if (bVar2) {
            fprintf(local_530,"UNSAT\n");
          }
          else {
            fprintf(local_530,"INDET\n");
          }
        }
        fclose(local_530);
      }
      bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_True);
      if (bVar2) {
        local_5a0 = 10;
      }
      else {
        bVar2 = Minisat::lbool::operator==(&local_4a9,Minisat::l_False);
        local_5a0 = 0;
        if (bVar2) {
          local_5a0 = 0x14;
        }
      }
      argv_local._4_4_ = local_5a0;
      Minisat::vec<Minisat::Lit,_int>::~vec((vec<Minisat::Lit,_int> *)&i);
      Minisat::Solver::~Solver((Solver *)&initial_time);
      Minisat::BoolOption::~BoolOption((BoolOption *)local_118);
      Minisat::IntOption::~IntOption((IntOption *)local_e0);
      Minisat::IntOption::~IntOption((IntOption *)local_a0);
      Minisat::IntOption::~IntOption((IntOption *)local_60);
      return argv_local._4_4_;
    }
    if (local_530 != (FILE *)0x0) {
      fprintf(local_530,"UNSAT\n");
      fclose(local_530);
    }
    if (0 < iVar4) {
      printf("===============================================================================\n");
      printf("Solved by unit propagation\n");
      Minisat::Solver::printStats();
      printf("\n");
    }
    printf("UNSATISFIABLE\n");
    exit(0x14);
  }
  if ((int)argv_local == 1) {
    local_510 = "<stdin>";
  }
  else {
    local_510 = argv[1];
  }
  printf("ERROR! Could not open file: %s\n",local_510);
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    try {
        setUsageHelp("USAGE: %s [options] <input-file> <result-output-file>\n\n  where input may be either in plain or gzipped DIMACS.\n");
        setX86FPUPrecision();

        // Extra options:
        //
        IntOption    verb   ("MAIN", "verb",   "Verbosity level (0=silent, 1=some, 2=more).", 1, IntRange(0, 2));
        IntOption    cpu_lim("MAIN", "cpu-lim","Limit on CPU time allowed in seconds.\n", 0, IntRange(0, INT32_MAX));
        IntOption    mem_lim("MAIN", "mem-lim","Limit on memory usage in megabytes.\n", 0, IntRange(0, INT32_MAX));
        BoolOption   strictp("MAIN", "strict", "Validate DIMACS header during parsing.", false);
        
        parseOptions(argc, argv, true);

        Solver S;
        double initial_time = cpuTime();

        S.verbosity = verb;
        
        solver = &S;
        // Use signal handlers that forcibly quit until the solver will be able to respond to
        // interrupts:
        sigTerm(SIGINT_exit);

        // Try to set resource limits:
        if (cpu_lim != 0) limitTime(cpu_lim);
        if (mem_lim != 0) limitMemory(mem_lim);
        
        if (argc == 1)
            printf("Reading from standard input... Use '--help' for help.\n");
        
        gzFile in = (argc == 1) ? gzdopen(0, "rb") : gzopen(argv[1], "rb");
        if (in == NULL)
            printf("ERROR! Could not open file: %s\n", argc == 1 ? "<stdin>" : argv[1]), exit(1);
        
        if (S.verbosity > 0){
            printf("============================[ Problem Statistics ]=============================\n");
            printf("|                                                                             |\n"); }
        
        parse_DIMACS(in, S, (bool)strictp);
        gzclose(in);
        FILE* res = (argc >= 3) ? fopen(argv[2], "wb") : NULL;
        
        if (S.verbosity > 0){
            printf("|  Number of variables:  %12d                                         |\n", S.nVars());
            printf("|  Number of clauses:    %12d                                         |\n", S.nClauses()); }
        
        double parsed_time = cpuTime();
        if (S.verbosity > 0){
            printf("|  Parse time:           %12.2f s                                       |\n", parsed_time - initial_time);
            printf("|                                                                             |\n"); }
 
        // Change to signal-handlers that will only notify the solver and allow it to terminate
        // voluntarily:
        sigTerm(SIGINT_interrupt);
       
        if (!S.simplify()){
            if (res != NULL) fprintf(res, "UNSAT\n"), fclose(res);
            if (S.verbosity > 0){
                printf("===============================================================================\n");
                printf("Solved by unit propagation\n");
                S.printStats();
                printf("\n"); }
            printf("UNSATISFIABLE\n");
            exit(20);
        }
        
        vec<Lit> dummy;
        lbool ret = S.solveLimited(dummy);
        if (S.verbosity > 0){
            S.printStats();
            printf("\n"); }
        printf(ret == l_True ? "SATISFIABLE\n" : ret == l_False ? "UNSATISFIABLE\n" : "INDETERMINATE\n");
        if (res != NULL){
            if (ret == l_True){
                fprintf(res, "SAT\n");
                for (int i = 0; i < S.nVars(); i++)
                    if (S.model[i] != l_Undef)
                        fprintf(res, "%s%s%d", (i==0)?"":" ", (S.model[i]==l_True)?"":"-", i+1);
                fprintf(res, " 0\n");
            }else if (ret == l_False)
                fprintf(res, "UNSAT\n");
            else
                fprintf(res, "INDET\n");
            fclose(res);
        }
        
#ifdef NDEBUG
        exit(ret == l_True ? 10 : ret == l_False ? 20 : 0);     // (faster than "return", which will invoke the destructor for 'Solver')
#else
        return (ret == l_True ? 10 : ret == l_False ? 20 : 0);
#endif
    } catch (OutOfMemoryException&){
        printf("===============================================================================\n");
        printf("INDETERMINATE\n");
        exit(0);
    }
}